

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowReturnOneRow(Parse *pParse,Window *pMWin,int regGosub,int addrGosub)

{
  Window **ppWVar1;
  int p1;
  int p1_00;
  FuncDef *pFVar2;
  char *pcVar3;
  int *piVar4;
  byte bVar5;
  uint uVar6;
  Vdbe *p;
  int iVar7;
  int p2;
  Window *pWVar8;
  
  p = sqlite3GetVdbe(pParse);
  pWVar8 = pMWin;
  if (pMWin != (Window *)0x0) {
    do {
      pFVar2 = pWVar8->pFunc;
      pcVar3 = pFVar2->zName;
      if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
        iVar7 = pWVar8->csrApp;
        uVar6 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
        if (pParse->nTempReg == '\0') {
          p2 = pParse->nMem + 1;
          pParse->nMem = p2;
        }
        else {
          bVar5 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar5;
          p2 = pParse->aTempReg[bVar5];
        }
        sqlite3VdbeAddOp3(p,0x49,0,pWVar8->regResult,0);
        if (pFVar2->zName == "nth_value") {
          sqlite3VdbeAddOp3(p,0x5a,pMWin->iEphCsr,pWVar8->iArgCol + 1,p2);
          windowCheckIntValue(pParse,p2,2);
        }
        else {
          sqlite3VdbeAddOp3(p,0x46,1,p2,0);
        }
        sqlite3VdbeAddOp3(p,0x60,p2,pWVar8->regApp,p2);
        sqlite3VdbeAddOp3(p,0x36,pWVar8->regApp + 1,uVar6,p2);
        sqlite3VdbeAddOp3(p,0x1e,iVar7,0,p2);
        sqlite3VdbeAddOp3(p,0x5a,iVar7,pWVar8->iArgCol,pWVar8->regResult);
        piVar4 = p->pParse->aLabel;
        if (piVar4 != (int *)0x0) {
          piVar4[(int)~uVar6] = p->nOp;
        }
        if (p2 != 0) {
          bVar5 = pParse->nTempReg;
joined_r0x001938c7:
          if (bVar5 < 8) {
            pParse->nTempReg = bVar5 + 1;
            pParse->aTempReg[bVar5] = p2;
          }
        }
      }
      else {
        if (pcVar3 != "lead" && pcVar3 != "lag") goto LAB_001938df;
        iVar7 = ((pWVar8->pOwner->x).pList)->nExpr;
        p1 = pMWin->iEphCsr;
        p1_00 = pWVar8->csrApp;
        uVar6 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
        if (pParse->nTempReg == '\0') {
          p2 = pParse->nMem + 1;
          pParse->nMem = p2;
        }
        else {
          bVar5 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar5;
          p2 = pParse->aTempReg[bVar5];
        }
        if (iVar7 < 3) {
          sqlite3VdbeAddOp3(p,0x49,0,pWVar8->regResult,0);
          sqlite3VdbeAddOp3(p,0x81,p1,p2,0);
          if (iVar7 == 2) goto LAB_001937de;
          sqlite3VdbeAddOp3(p,0x53,p2,(uint)(pFVar2->zName == "lead") * 2 + -1,0);
        }
        else {
          sqlite3VdbeAddOp3(p,0x5a,p1,pWVar8->iArgCol + 2,pWVar8->regResult);
          sqlite3VdbeAddOp3(p,0x81,p1,p2,0);
LAB_001937de:
          pcVar3 = pFVar2->zName;
          if (pParse->nTempReg == '\0') {
            iVar7 = pParse->nMem + 1;
            pParse->nMem = iVar7;
          }
          else {
            bVar5 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar5;
            iVar7 = pParse->aTempReg[bVar5];
          }
          sqlite3VdbeAddOp3(p,0x5a,p1,pWVar8->iArgCol + 1,iVar7);
          sqlite3VdbeAddOp3(p,pcVar3 == "lead" ^ 0x61,iVar7,p2,p2);
          if (iVar7 != 0) {
            bVar5 = pParse->nTempReg;
            if ((ulong)bVar5 < 8) {
              pParse->nTempReg = bVar5 + 1;
              pParse->aTempReg[bVar5] = iVar7;
            }
          }
        }
        sqlite3VdbeAddOp3(p,0x1e,p1_00,uVar6,p2);
        sqlite3VdbeAddOp3(p,0x5a,p1_00,pWVar8->iArgCol,pWVar8->regResult);
        piVar4 = p->pParse->aLabel;
        if (piVar4 != (int *)0x0) {
          piVar4[(int)~uVar6] = p->nOp;
        }
        if (p2 != 0) {
          bVar5 = pParse->nTempReg;
          goto joined_r0x001938c7;
        }
      }
LAB_001938df:
      ppWVar1 = &pWVar8->pNextWin;
      pWVar8 = *ppWVar1;
    } while (*ppWVar1 != (Window *)0x0);
  }
  sqlite3VdbeAddOp3(p,0xc,regGosub,addrGosub,0);
  return;
}

Assistant:

static void windowReturnOneRow(
  Parse *pParse,
  Window *pMWin,
  int regGosub,
  int addrGosub
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    if( pFunc->zName==nth_valueName
     || pFunc->zName==first_valueName
    ){
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

      if( pFunc->zName==nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+1,tmpReg);
        windowCheckIntValue(pParse, tmpReg, 2);
      }else{
        sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
      }
      sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
      sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
      VdbeCoverageNeverNull(v);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
      VdbeCoverageNeverTaken(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
    else if( pFunc->zName==leadName || pFunc->zName==lagName ){
      int nArg = pWin->pOwner->x.pList->nExpr;
      int iEph = pMWin->iEphCsr;
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);

      if( nArg<3 ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+2, pWin->regResult);
      }
      sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
      if( nArg<2 ){
        int val = (pFunc->zName==leadName ? 1 : -1);
        sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
      }else{
        int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
        int tmpReg2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
        sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
        sqlite3ReleaseTempReg(pParse, tmpReg2);
      }

      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, regGosub, addrGosub);
}